

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmalloc.c
# Opt level: O0

void * xmalloc(int size)

{
  xmalloc_block *pxVar1;
  xmalloc_block *b;
  void *mem;
  void *pvStack_10;
  int size_local;
  
  pvStack_10 = malloc((long)size);
  if (pvStack_10 == (void *)0x0) {
    pvStack_10 = (void *)0x0;
  }
  else {
    pxVar1 = (xmalloc_block *)malloc(0x10);
    if (pxVar1 == (xmalloc_block *)0x0) {
      free(pvStack_10);
      pvStack_10 = (void *)0x0;
    }
    else {
      pxVar1->mem = pvStack_10;
      pxVar1->next = xm_blocklist;
      xm_blocklist = pxVar1;
    }
  }
  return pvStack_10;
}

Assistant:

void *xmalloc(int size)
{
    void *mem;
    struct xmalloc_block *b;
    
    mem = malloc(size);
    if (!mem)
	return NULL;
    
    b = malloc(sizeof(struct xmalloc_block));
    if (!b) {
	free(mem);
	return NULL;
    }
       
    b->mem = mem;
    b->next = xm_blocklist;
    xm_blocklist = b;
    
    return mem;
}